

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O0

void __thiscall
CaDiCaL::External::push_external_clause_and_witness_on_extension_stack
          (External *this,vector<int,_std::allocator<int>_> *c,vector<int,_std::allocator<int>_> *w,
          uint64_t id)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  const_iterator this_00;
  const_iterator __x;
  undefined8 in_RDX;
  External *in_RDI;
  int *elit_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  uint32_t lower_bits;
  uint32_t higher_bits;
  int *elit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  value_type_conflict3 *in_stack_ffffffffffffff88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff90;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_18;
  
  local_24 = 0;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_RDI);
  local_30 = local_18;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff80,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (!bVar2) break;
    puVar3 = (uint *)__gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_38);
    uVar1 = *puVar3;
    if ((int)uVar1 < 1) {
      uVar1 = -uVar1;
    }
    init(in_RDI,(EVP_PKEY_CTX *)(ulong)uVar1);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90._M_current,
               in_stack_ffffffffffffff88);
    mark((External *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90._M_current >> 0x20));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_RDI);
  this_00 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)in_RDI);
  __x = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff80,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (!bVar2) break;
    in_stack_ffffffffffffff80 =
         (vector<int,_std::allocator<int>_> *)
         __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
         operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffff90);
    uVar1 = *(uint *)&(in_stack_ffffffffffffff80->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
    if ((int)uVar1 < 1) {
      uVar1 = -uVar1;
    }
    init(in_RDI,(EVP_PKEY_CTX *)(ulong)uVar1);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00._M_current,__x._M_current);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff90);
  }
  return;
}

Assistant:

void External::push_external_clause_and_witness_on_extension_stack (
    const vector<int> &c, const vector<int> &w, uint64_t id) {
  assert (id);
  extension.push_back (0);
  for (const auto &elit : w) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
    mark (witness, elit);
  }
  extension.push_back (0);
  const uint32_t higher_bits = static_cast<int> (id << 32);
  const uint32_t lower_bits = (id & (((uint64_t) 1 << 32) - 1));
  extension.push_back (higher_bits);
  extension.push_back (lower_bits);
  extension.push_back (0);
  for (const auto &elit : c) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
  }
}